

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

void __thiscall
rsg::SwizzleOp::SwizzleOp(SwizzleOp *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  ValueRange *this_00;
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  int elemNdx;
  long lVar4;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar5;
  set<int,_std::less<int>,_std::allocator<int>_> availableElements;
  int local_80;
  int local_7c;
  GeneratorState *local_78;
  ExecValueStorage *local_70;
  ValueRange *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__SwizzleOp_021d1680;
  this_00 = &this->m_outValueRange;
  local_78 = state;
  ValueRange::ValueRange(this_00,valueRange);
  this->m_numInputElements = 0;
  this->m_child = (Expression *)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = &this->m_value;
  local_68 = this_00;
  iVar1 = VariableType::getScalarSize(&this_00->m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::resize
            (&(this->m_value).m_value,(long)(iVar1 << 6));
  iVar1 = (this->m_outValueRange).m_type.m_numElements;
  dVar2 = deRandom_getUint32(&local_78->m_random->m_rnd);
  iVar3 = 2;
  if (2 < iVar1) {
    iVar3 = iVar1;
  }
  this->m_numInputElements = dVar2 % (5U - iVar3) + iVar3;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < this->m_numInputElements) {
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,&local_80);
      local_80 = local_80 + 1;
    } while (local_80 < this->m_numInputElements);
  }
  lVar4 = 0;
  do {
    if (lVar4 < iVar1) {
      local_80 = 0;
      de::Random::choose<std::_Rb_tree_const_iterator<int>,int*>
                (local_78->m_random,
                 (_Rb_tree_const_iterator<int>)
                 local_60._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<int>)&local_60._M_impl.super__Rb_tree_header,&local_80,1);
      local_7c = local_80;
      pVar5 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              equal_range(&local_60,&local_7c);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_erase_aux(&local_60,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node);
      this->m_swizzle[lVar4] = (deUint8)local_7c;
    }
    else {
      this->m_swizzle[lVar4] = '\0';
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

SwizzleOp::SwizzleOp (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_outValueRange		(valueRange)
	, m_numInputElements	(0)
	, m_child				(DE_NULL)
{
	DE_ASSERT(!m_outValueRange.getType().isVoid()); // \todo [2011-06-13 pyry] Void support
	DE_ASSERT(m_outValueRange.getType().isFloatOrVec()	||
			  m_outValueRange.getType().isIntOrVec()	||
			  m_outValueRange.getType().isBoolOrVec());

	m_value.setStorage(m_outValueRange.getType());

	int numOutputElements	= m_outValueRange.getType().getNumElements();

	// \note Swizzle works for vector types only.
	// \todo [2011-06-13 pyry] Use components multiple times.
	m_numInputElements		= state.getRandom().getInt(deMax32(numOutputElements, 2), 4);

	std::set<int> availableElements;
	for (int ndx = 0; ndx < m_numInputElements; ndx++)
		availableElements.insert(ndx);

	// Randomize swizzle.
	for (int elemNdx = 0; elemNdx < (int)DE_LENGTH_OF_ARRAY(m_swizzle); elemNdx++)
	{
		if (elemNdx < numOutputElements)
		{
			int inElemNdx = state.getRandom().choose<int>(availableElements.begin(), availableElements.end());
			availableElements.erase(inElemNdx);
			m_swizzle[elemNdx] = (deUint8)inElemNdx;
		}
		else
			m_swizzle[elemNdx] = 0;
	}
}